

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.hpp
# Opt level: O2

unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> __thiscall
qclab::dense::alloc_unique_array<std::complex<float>>(dense *this,int64_t size)

{
  void *__s;
  __uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_> local_20;
  
  if (0 < size) {
    __s = operator_new__(-(ulong)((ulong)size >> 0x3d != 0) | size << 3);
    memset(__s,0,size << 3);
    *(void **)this = __s;
    local_20._M_t.
    super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
    super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
         (tuple<std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>)
         (_Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>)0x0;
    std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
              ((unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> *)
               &local_20);
    return (__uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
            )(__uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
              )this;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/memory.hpp"
                ,0x12,
                "auto qclab::dense::alloc_unique_array(const int64_t) [T = std::complex<float>]");
}

Assistant:

inline auto alloc_unique_array( const int64_t size ) {
      assert( size > 0 ) ;
      std::unique_ptr< T[] > mem( new T[size] ) ;
      assert( mem.get() != nullptr ) ;
      return mem ;
    }